

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseStack.c
# Opt level: O2

Parse_StackOp_t * Parse_StackOpStart(int nDepth)

{
  Parse_StackOp_t *pPVar1;
  int *piVar2;
  
  pPVar1 = (Parse_StackOp_t *)calloc(1,0x10);
  piVar2 = (int *)malloc((long)nDepth * 4);
  pPVar1->pData = piVar2;
  pPVar1->Size = nDepth;
  return pPVar1;
}

Assistant:

Parse_StackOp_t * Parse_StackOpStart( int nDepth )
{
    Parse_StackOp_t * p;
    p = ABC_ALLOC( Parse_StackOp_t, 1 );
    memset( p, 0, sizeof(Parse_StackOp_t) );
    p->pData = ABC_ALLOC( int, nDepth );
    p->Size = nDepth;
    return p;
}